

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

CordzStatistics * __thiscall
absl::cord_internal::CordzInfo::GetCordzStatistics
          (CordzStatistics *__return_storage_ptr__,CordzInfo *this)

{
  size_t *psVar1;
  RefcountAndFlags *pRVar2;
  uint8_t uVar3;
  CordRep *rep;
  MethodIdentifier MVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  CordRep *pCVar8;
  int i;
  long lVar9;
  undefined1 auVar10 [16];
  RepRef RVar11;
  CordRepAnalyzer analyzer;
  CordRepAnalyzer local_30;
  
  lVar9 = 0;
  memset(__return_storage_ptr__,0,0x150);
  MVar4 = this->parent_method_;
  __return_storage_ptr__->method = this->method_;
  __return_storage_ptr__->parent_method = MVar4;
  do {
    (__return_storage_ptr__->update_tracker).values_[lVar9].super_atomic<long>.
    super___atomic_base<long>._M_i =
         (this->update_tracker_).values_[lVar9].super_atomic<long>.super___atomic_base<long>._M_i;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x19);
  Mutex::Lock(&this->mutex_);
  rep = this->rep_;
  if (rep != (CordRep *)0x0) {
    LOCK();
    (rep->refcount).count_.super___atomic_base<int>._M_i =
         (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
  }
  Mutex::Unlock(&this->mutex_);
  if (rep != (CordRep *)0x0) {
    __return_storage_ptr__->size = rep->length;
    local_30.memory_usage_.total = 0;
    local_30.memory_usage_.fair_share = 0.0;
    uVar5 = (rep->refcount).count_.super___atomic_base<int>._M_i >> 1;
    iVar6 = 1;
    if (1 < uVar5) {
      iVar6 = uVar5 - 1;
    }
    sVar7 = (size_t)iVar6;
    local_30.statistics_ = __return_storage_ptr__;
    if (rep->tag == '\x02') {
      __return_storage_ptr__->node_count = __return_storage_ptr__->node_count + 1;
      psVar1 = &(__return_storage_ptr__->node_counts).crc;
      *psVar1 = *psVar1 + 1;
      local_30.memory_usage_.total = 0x20;
      auVar10._8_4_ = iVar6 >> 0x1f;
      auVar10._0_8_ = sVar7;
      auVar10._12_4_ = 0x45300000;
      local_30.memory_usage_.fair_share =
           32.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) + 0.0;
      pCVar8 = (CordRep *)rep[1].length;
      if (pCVar8 == (CordRep *)0x0) {
        pCVar8 = (CordRep *)0x0;
        sVar7 = 0;
      }
      else {
        sVar7 = sVar7 * (long)((pCVar8->refcount).count_.super___atomic_base<int>._M_i >> 1);
        local_30.memory_usage_.total = 0x20;
      }
    }
    else {
      pCVar8 = rep;
      if (rep->tag == '\0') goto LAB_00175c5e;
    }
    RVar11.refcount = sVar7;
    RVar11.rep = pCVar8;
    RVar11 = anon_unknown_16::CordRepAnalyzer::CountLinearReps
                       (&local_30,RVar11,&local_30.memory_usage_);
    if (RVar11.rep != (CordRep *)0x0) {
      uVar3 = (RVar11.rep)->tag;
      if (uVar3 != '\x03') {
        if (uVar3 != '\0') {
          __assert_fail("false && \"repref.tag() == CordRepKind::UNUSED_0\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cordz_info.cc"
                        ,0x66,
                        "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::AnalyzeCordRep(const CordRep *)::(anonymous class)::operator()() const"
                       );
        }
LAB_00175c5e:
        __assert_fail("false && \"rep == nullptr || rep->tag != CordRepKind::UNUSED_0\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cordz_info.cc"
                      ,0x83,
                      "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::RepRef::tag()::(anonymous class)::operator()() const"
                     );
      }
      anon_unknown_16::CordRepAnalyzer::AnalyzeBtree(&local_30,RVar11);
    }
    (local_30.statistics_)->estimated_memory_usage =
         (local_30.statistics_)->estimated_memory_usage + local_30.memory_usage_.total;
    (local_30.statistics_)->estimated_fair_share_memory_usage =
         (local_30.statistics_)->estimated_fair_share_memory_usage +
         ((long)(local_30.memory_usage_.fair_share - 9.223372036854776e+18) &
          (long)local_30.memory_usage_.fair_share >> 0x3f | (long)local_30.memory_usage_.fair_share)
    ;
    LOCK();
    pRVar2 = &rep->refcount;
    uVar5 = (pRVar2->count_).super___atomic_base<int>._M_i;
    (pRVar2->count_).super___atomic_base<int>._M_i =
         (pRVar2->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar5 & 1) == 0 && (int)uVar5 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                    ,0xab,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar5 == 2) {
      CordRep::Destroy(rep);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CordzStatistics CordzInfo::GetCordzStatistics() const {
  CordzStatistics stats;
  stats.method = method_;
  stats.parent_method = parent_method_;
  stats.update_tracker = update_tracker_;
  if (CordRep* rep = RefCordRep()) {
    stats.size = rep->length;
    CordRepAnalyzer analyzer(stats);
    analyzer.AnalyzeCordRep(rep);
    CordRep::Unref(rep);
  }
  return stats;
}